

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsRun(JsValueRef scriptVal,JsSourceContext sourceContext,JsValueRef sourceUrl,
     JsParseScriptAttributes parseAttributes,JsValueRef *result)

{
  anon_class_48_6_2009d855 fn;
  uint uVar1;
  WCHAR **in_stack_ffffffffffffff38;
  JsValueRef *result_local;
  JsParseScriptAttributes parseAttributes_local;
  JsValueRef sourceUrl_local;
  JsSourceContext sourceContext_local;
  JsValueRef scriptVal_local;
  WCHAR *pWStack_60;
  JsErrorCode error;
  WCHAR *url;
  size_t cb;
  byte *script;
  LoadScriptFlag scriptFlag;
  bool isUtf8;
  bool isString;
  bool isExternalArray;
  JsParseScriptAttributes local_34;
  JsValueRef local_30;
  JsSourceContext local_28;
  long *local_20;
  JsErrorCode local_14;
  
  script._7_1_ = 0;
  if (scriptVal == (JsValueRef)0x0) {
    local_14 = JsErrorNullArgument;
  }
  else if (scriptVal == (JsValueRef)0x0) {
    local_14 = JsErrorInvalidArgument;
  }
  else if (sourceUrl == (JsValueRef)0x0) {
    local_14 = JsErrorNullArgument;
  }
  else {
    _scriptFlag = result;
    local_34 = parseAttributes;
    local_30 = sourceUrl;
    local_28 = sourceContext;
    local_20 = (long *)scriptVal;
    script._6_1_ = Js::VarIs<Js::ArrayBuffer>(scriptVal);
    script._5_1_ = 0;
    script._4_1_ = ((local_34 & JsParseScriptAttributeArrayBufferIsUtf16Encoded) !=
                    JsParseScriptAttributeNone ^ 0xffU) & 1;
    script._0_4_ = LoadScriptFlag_None;
    if ((bool)script._6_1_) {
      cb = (**(code **)(*local_20 + 0x390))();
      uVar1 = (**(code **)(*local_20 + 0x388))();
      url = (WCHAR *)(ulong)uVar1;
      script._0_4_ = LoadScriptFlag_ExternalArrayBuffer;
      if ((script._4_1_ & 1) != 0) {
        script._0_4_ = LoadScriptFlag_ExternalArrayBuffer|LoadScriptFlag_Utf8Source;
      }
    }
    else {
      script._5_1_ = Js::VarIs<Js::JavascriptString>(local_20);
      if (!(bool)script._5_1_) {
        return JsErrorInvalidArgument;
      }
    }
    fn.scriptVal._0_4_ = (int)&cb;
    fn.isString = (bool *)&local_20;
    fn.scriptVal._4_4_ = (int)((ulong)&cb >> 0x20);
    fn.script = (byte **)&url;
    fn.cb = (size_t *)&local_30;
    fn.sourceUrl = &stack0xffffffffffffffa0;
    fn.url = in_stack_ffffffffffffff38;
    local_14 = GlobalAPIWrapper_NoRecord<CompileRun(void*,unsigned_long,void*,_JsParseScriptAttributes,void**,bool)::__0>
                         (fn);
    if (local_14 == JsNoError) {
      local_14 = RunScriptCore(local_20,(byte *)cb,(size_t)url,(LoadScriptFlag)script,local_28,
                               pWStack_60,(bool)(script._7_1_ & 1),local_34,false,_scriptFlag);
    }
  }
  return local_14;
}

Assistant:

CHAKRA_API JsRun(
    _In_ JsValueRef scriptVal,
    _In_ JsSourceContext sourceContext,
    _In_ JsValueRef sourceUrl,
    _In_ JsParseScriptAttributes parseAttributes,
    _Out_ JsValueRef *result)
{
    return CompileRun(scriptVal, sourceContext, sourceUrl, parseAttributes,
        result, false);
}